

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::~Graph(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  Graph *this_local;
  
  pvVar1 = this->adjacencyVector;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    this_00 = pvVar1 + (long)pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
    while (pvVar1 != this_00) {
      this_00 = this_00 + -1;
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->inDegree != (int *)0x0) {
    operator_delete__(this->inDegree);
  }
  return;
}

Assistant:

Graph::~Graph() {
    delete[] adjacencyVector;
    delete[] inDegree;
}